

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O1

void __thiscall ezc3d::ParametersNS::Parameters::setMandatoryParameters(Parameters *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  size_t sVar3;
  Group *pGVar4;
  Parameter p;
  string local_128;
  string local_108;
  Parameter local_e8;
  undefined8 local_38;
  
  paVar1 = &local_e8._name.field_2;
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"POINT","");
  bVar2 = isGroup(this,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"POINT","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Group::Group((Group *)&local_e8,&local_128,&local_108);
    group(this,(Group *)&local_e8);
    std::
    vector<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
    ::~vector((vector<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
               *)&local_e8._dimension);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._description._M_dataplus._M_p != &local_e8._description.field_2) {
      operator_delete(local_e8._description._M_dataplus._M_p,
                      local_e8._description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._name._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._name._M_dataplus._M_p,
                      local_e8._name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"POINT","");
  sVar3 = groupIdx(this,&local_e8._name);
  pGVar4 = group(this,sVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"USED","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"USED","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    GroupNS::Parameter::set(&local_e8,0);
    GroupNS::Parameter::lock(&local_e8);
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"LABELS","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"LABELS","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_128,0,0);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_e8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_128,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_128);
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"DESCRIPTIONS","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"DESCRIPTIONS","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_128,0,0);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_e8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_128,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_128);
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"SCALE","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"SCALE","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    GroupNS::Parameter::set(&local_e8,-1.0);
    GroupNS::Parameter::lock(&local_e8);
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"UNITS","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"UNITS","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_128,0,0);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_e8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_128,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_128);
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"RATE","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"RATE","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    GroupNS::Parameter::set(&local_e8,0.0);
    GroupNS::Parameter::lock(&local_e8);
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"DATA_START","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"DATA_START","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    GroupNS::Parameter::set(&local_e8,0);
    GroupNS::Parameter::lock(&local_e8);
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"FRAMES","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"FRAMES","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    GroupNS::Parameter::set(&local_e8,0);
    GroupNS::Parameter::lock(&local_e8);
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ANALOG","");
  bVar2 = isGroup(this,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"ANALOG","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Group::Group((Group *)&local_e8,&local_128,&local_108);
    group(this,(Group *)&local_e8);
    std::
    vector<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
    ::~vector((vector<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
               *)&local_e8._dimension);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._description._M_dataplus._M_p != &local_e8._description.field_2) {
      operator_delete(local_e8._description._M_dataplus._M_p,
                      local_e8._description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._name._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._name._M_dataplus._M_p,
                      local_e8._name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ANALOG","");
  sVar3 = groupIdx(this,&local_e8._name);
  pGVar4 = group(this,sVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"USED","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"USED","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    GroupNS::Parameter::set(&local_e8,0);
    GroupNS::Parameter::lock(&local_e8);
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"LABELS","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"LABELS","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_128,0,0);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_e8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_128,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_128);
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"DESCRIPTIONS","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"DESCRIPTIONS","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_128,0,0);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_e8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_128,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_128);
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"GEN_SCALE","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"GEN_SCALE","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    GroupNS::Parameter::set(&local_e8,1.0);
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"SCALE","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"SCALE","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
              ((vector<double,std::allocator<double>> *)&local_128,0,0);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_e8,(vector<double,_std::allocator<double>_> *)&local_128,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_128._M_dataplus._M_p,
                      local_128.field_2._M_allocated_capacity - (long)local_128._M_dataplus._M_p);
    }
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"OFFSET","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"OFFSET","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)&local_128,0,0);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_e8,(vector<int,_std::allocator<int>_> *)&local_128,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_128._M_dataplus._M_p,
                      local_128.field_2._M_allocated_capacity - (long)local_128._M_dataplus._M_p);
    }
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"UNITS","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"UNITS","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_128,0,0);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_e8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_128,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_128);
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"RATE","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"RATE","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    GroupNS::Parameter::set(&local_e8,0.0);
    GroupNS::Parameter::lock(&local_e8);
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"FORMAT","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"FORMAT","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_128,0,0);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_e8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_128,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_128);
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"BITS","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"BITS","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)&local_128,0,0);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_e8,(vector<int,_std::allocator<int>_> *)&local_128,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_128._M_dataplus._M_p,
                      local_128.field_2._M_allocated_capacity - (long)local_128._M_dataplus._M_p);
    }
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"FORCE_PLATFORM","");
  bVar2 = isGroup(this,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"FORCE_PLATFORM","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Group::Group((Group *)&local_e8,&local_128,&local_108);
    group(this,(Group *)&local_e8);
    std::
    vector<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
    ::~vector((vector<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
               *)&local_e8._dimension);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._description._M_dataplus._M_p != &local_e8._description.field_2) {
      operator_delete(local_e8._description._M_dataplus._M_p,
                      local_e8._description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._name._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._name._M_dataplus._M_p,
                      local_e8._name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"FORCE_PLATFORM","");
  sVar3 = groupIdx(this,&local_e8._name);
  pGVar4 = group(this,sVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"USED","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"USED","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    GroupNS::Parameter::set(&local_e8,0);
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"TYPE","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"TYPE","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)&local_128,0,0);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_e8,(vector<int,_std::allocator<int>_> *)&local_128,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_128._M_dataplus._M_p,
                      local_128.field_2._M_allocated_capacity - (long)local_128._M_dataplus._M_p);
    }
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ZERO","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"ZERO","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_38 = 1;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)&local_128,&local_38);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_e8,(vector<int,_std::allocator<int>_> *)&local_128,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_128._M_dataplus._M_p,
                      local_128.field_2._M_allocated_capacity - (long)local_128._M_dataplus._M_p);
    }
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"CORNERS","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"CORNERS","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
              ((vector<double,std::allocator<double>> *)&local_128,0,0);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_e8,(vector<double,_std::allocator<double>_> *)&local_128,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_128._M_dataplus._M_p,
                      local_128.field_2._M_allocated_capacity - (long)local_128._M_dataplus._M_p);
    }
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ORIGIN","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"ORIGIN","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
              ((vector<double,std::allocator<double>> *)&local_128,0,0);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_e8,(vector<double,_std::allocator<double>_> *)&local_128,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_128._M_dataplus._M_p,
                      local_128.field_2._M_allocated_capacity - (long)local_128._M_dataplus._M_p);
    }
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"CHANNEL","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"CHANNEL","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)&local_128,0,0);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_e8,(vector<int,_std::allocator<int>_> *)&local_128,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_128._M_dataplus._M_p,
                      local_128.field_2._M_allocated_capacity - (long)local_128._M_dataplus._M_p);
    }
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  local_e8._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"CAL_MATRIX","");
  bVar2 = GroupNS::Group::isParameter(pGVar4,&local_e8._name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._name._M_dataplus._M_p,local_e8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar2) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"CAL_MATRIX","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    GroupNS::Parameter::Parameter(&local_e8,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
              ((vector<double,std::allocator<double>> *)&local_128,0,0);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_e8,(vector<double,_std::allocator<double>_> *)&local_128,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
    if (local_108._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    if (local_128._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_128._M_dataplus._M_p,
                      local_128.field_2._M_allocated_capacity - (long)local_128._M_dataplus._M_p);
    }
    GroupNS::Group::parameter(pGVar4,&local_e8);
    GroupNS::Parameter::~Parameter(&local_e8);
  }
  return;
}

Assistant:

void ezc3d::ParametersNS::Parameters::setMandatoryParameters() {
  // Mandatory groups
  {
    if (!isGroup("POINT")) {
      group(ezc3d::ParametersNS::GroupNS::Group("POINT"));
    }

    ezc3d::ParametersNS::GroupNS::Group &grp(group("POINT"));
    if (!grp.isParameter("USED")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("USED", "");
      p.set(0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("LABELS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("LABELS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("DESCRIPTIONS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("DESCRIPTIONS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("SCALE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("SCALE", "");
      p.set(-1.0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("UNITS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("UNITS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("RATE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("RATE", "");
      p.set(0.0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("DATA_START")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("DATA_START", "");
      p.set(0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("FRAMES")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("FRAMES", "");
      p.set(0);
      p.lock();
      grp.parameter(p);
    }
  }
  {
    if (!isGroup("ANALOG")) {
      group(ezc3d::ParametersNS::GroupNS::Group("ANALOG"));
    }

    ezc3d::ParametersNS::GroupNS::Group &grp(group("ANALOG"));
    if (!grp.isParameter("USED")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("USED", "");
      p.set(0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("LABELS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("LABELS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("DESCRIPTIONS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("DESCRIPTIONS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("GEN_SCALE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("GEN_SCALE", "");
      p.set(1.0);
      grp.parameter(p);
    }
    if (!grp.isParameter("SCALE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("SCALE", "");
      p.set(std::vector<double>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("OFFSET")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("OFFSET", "");
      p.set(std::vector<int>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("UNITS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("UNITS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("RATE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("RATE", "");
      p.set(0.0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("FORMAT")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("FORMAT", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("BITS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("BITS", "");
      p.set(std::vector<int>() = {});
      grp.parameter(p);
    }
  }
  {
    if (!isGroup("FORCE_PLATFORM")) {
      group(ezc3d::ParametersNS::GroupNS::Group("FORCE_PLATFORM"));
    }

    ezc3d::ParametersNS::GroupNS::Group &grp(group("FORCE_PLATFORM"));
    if (!grp.isParameter("USED")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("USED", "");
      p.set(0);
      grp.parameter(p);
    }
    if (!grp.isParameter("TYPE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("TYPE", "");
      p.set(std::vector<int>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("ZERO")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("ZERO", "");
      p.set(std::vector<int>() = {1, 0});
      grp.parameter(p);
    }
    if (!grp.isParameter("CORNERS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("CORNERS", "");
      p.set(std::vector<double>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("ORIGIN")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("ORIGIN", "");
      p.set(std::vector<double>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("CHANNEL")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("CHANNEL", "");
      p.set(std::vector<int>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("CAL_MATRIX")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("CAL_MATRIX", "");
      p.set(std::vector<double>() = {});
      grp.parameter(p);
    }
  }
}